

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderDerivateTests::init(ShaderDerivateTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  DataType DVar2;
  int iVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  size_t sVar7;
  LinearDerivateCase *pLVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  Precision PVar13;
  bool bVar14;
  undefined1 auStack_228 [4];
  DerivateFunc local_224;
  TestNode *local_220;
  TestNode *local_218;
  long *local_210;
  long local_200 [2];
  ulong local_1f0;
  TestNode *local_1e8;
  TestNode *local_1e0;
  TestNode *local_1d8;
  undefined8 uStack_1d0;
  TestNode *local_1c0;
  long local_1b8;
  uint local_1ac;
  ostringstream caseName;
  ios_base local_138 [264];
  
  uVar11 = 0;
  local_1e8 = (TestNode *)this;
  do {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,
               (char *)((long)&DAT_00b1ab80 + (long)(int)(&DAT_00b1ab80)[uVar11]),
               (&PTR_anon_var_dwarf_18e244_00d0d998)[uVar11]);
    local_224 = (DerivateFunc)uVar11;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,"constant",
               "Derivate of constant argument");
    local_1e0 = pTVar4;
    tcu::TestNode::addChild(pTVar4,pTVar5);
    uVar10 = 1;
    do {
      DVar2 = TYPE_FLOAT;
      if (1 < uVar10) {
        DVar2 = glu::getDataTypeFloatVec(uVar10);
      }
      pTVar4 = (TestNode *)operator_new(0xf8);
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pcVar6 = glu::getDataTypeName(DVar2);
      tcu::TestCase::TestCase((TestCase *)pTVar4,pCVar1->m_testCtx,pcVar6,"");
      pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
      pTVar4[1].m_name._M_string_length = (size_type)((long)&pTVar4[1].m_name.field_2 + 8);
      pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar4[1].m_name.field_2._M_local_buf[8] = '\0';
      *(undefined1 (*) [16])&pTVar4[1].m_description._M_string_length = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&pTVar4[1].m_description.field_2 + 8) = (undefined1  [16])0x0;
      pTVar4[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar4[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &pTVar4[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      pTVar4[2].m_testCtx = (TestContext *)0x0;
      *(undefined4 *)&pTVar4[2].m_name._M_dataplus._M_p = 0x1100;
      pTVar4->_vptr_TestNode = (_func_int **)&PTR__TriangleDerivateCase_00d0d668;
      *(DerivateFunc *)((long)&pTVar4[2].m_name._M_dataplus._M_p + 4) = local_224;
      *(DataType *)&pTVar4[1].m_testCtx = DVar2;
      *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 2;
      *(DataType *)&pTVar4[1].m_name._M_dataplus._M_p = DVar2;
      *(undefined4 *)((long)&pTVar4[1].m_name._M_dataplus._M_p + 4) = 2;
      tcu::TestNode::addChild(pTVar5,pTVar4);
      uVar10 = uVar10 + 1;
      this = (ShaderDerivateTests *)local_1e8;
    } while (uVar10 != 5);
    lVar12 = 0;
    do {
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,
                 init::s_linearDerivateCases[lVar12].name,
                 init::s_linearDerivateCases[lVar12].description);
      local_218 = (TestNode *)init::s_linearDerivateCases[lVar12].source;
      local_1d8 = pTVar4;
      tcu::TestNode::addChild(local_1e0,pTVar4);
      local_220 = (TestNode *)CONCAT44(local_220._4_4_,1);
      do {
        PVar13 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < (uint)local_220) {
            DVar2 = glu::getDataTypeFloatVec((uint)local_220);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (lVar12 == 0 || PVar13 != PRECISION_LOWP) {
            pcVar6 = glu::getDataTypeName(DVar2);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar6 = glu::getPrecisionName(PVar13);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            pLVar8 = (LinearDerivateCase *)operator_new(0x118);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar8,pCVar1,(char *)local_210,"",local_224,DVar2,PVar13,0x1100,
                       SURFACETYPE_DEFAULT_FRAMEBUFFER,0,(char *)local_218);
            tcu::TestNode::addChild(local_1d8,(TestNode *)pLVar8);
            this = (ShaderDerivateTests *)local_1e8;
            if (local_210 != local_200) {
              operator_delete(local_210,local_200[0] + 1);
              this = (ShaderDerivateTests *)local_1e8;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          std::ios_base::~ios_base(local_138);
          PVar13 = PVar13 + PRECISION_MEDIUMP;
        } while (PVar13 != PRECISION_LAST);
        iVar3 = (uint)local_220 + 1;
        local_220 = (TestNode *)CONCAT44(local_220._4_4_,iVar3);
      } while (iVar3 != 5);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
    uVar11 = 0;
    do {
      pTVar4 = (TestNode *)operator_new(0x70);
      local_1f0 = uVar11;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,
                 init::s_fboConfigs[uVar11].name,"Derivate usage when rendering into FBO");
      local_220 = (TestNode *)(ulong)init::s_fboConfigs[uVar11].surfaceType;
      local_1d8 = (TestNode *)(ulong)(uint)init::s_fboConfigs[uVar11].numSamples;
      local_218 = pTVar4;
      tcu::TestNode::addChild(local_1e0,pTVar4);
      uVar10 = 1;
      do {
        PVar13 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < uVar10) {
            DVar2 = glu::getDataTypeFloatVec(uVar10);
          }
          bVar14 = (uint)local_220 == 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (bVar14 || PVar13 != PRECISION_LOWP) {
            pcVar6 = glu::getDataTypeName(DVar2);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar6 = glu::getPrecisionName(PVar13);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            pLVar8 = (LinearDerivateCase *)operator_new(0x118);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar8,pCVar1,(char *)local_210,"",local_224,DVar2,PVar13,0x1100,
                       (SurfaceType)local_220,(int)local_1d8,
                       "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                      );
            tcu::TestNode::addChild(local_218,(TestNode *)pLVar8);
            this = (ShaderDerivateTests *)local_1e8;
            if (local_210 != local_200) {
              operator_delete(local_210,local_200[0] + 1);
              this = (ShaderDerivateTests *)local_1e8;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          uVar9 = std::ios_base::~ios_base(local_138);
          PVar13 = PVar13 + PRECISION_MEDIUMP;
        } while (PVar13 != PRECISION_LAST);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 5);
      uVar11 = local_1f0 + 1;
    } while (uVar11 != 4);
    uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
    lVar12 = 0;
    do {
      local_1ac = (uint)uVar9;
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,init::s_hints[lVar12].name,
                 "Shader derivate hints");
      local_1f0 = (ulong)init::s_hints[lVar12].hint;
      tcu::TestNode::addChild(local_1e0,pTVar4);
      lVar12 = 0;
      local_1c0 = pTVar4;
      do {
        pTVar4 = local_1c0;
        pTVar5 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,
                   init::s_hintFboConfigs[lVar12].name,"");
        local_220 = (TestNode *)(ulong)init::s_hintFboConfigs[lVar12].surfaceType;
        local_218 = (TestNode *)(ulong)(uint)init::s_hintFboConfigs[lVar12].numSamples;
        local_1d8 = pTVar5;
        local_1b8 = lVar12;
        tcu::TestNode::addChild(pTVar4,pTVar5);
        uVar10 = 1;
        do {
          PVar13 = PRECISION_LOWP;
          do {
            DVar2 = TYPE_FLOAT;
            if (1 < uVar10) {
              DVar2 = glu::getDataTypeFloatVec(uVar10);
            }
            bVar14 = (uint)local_220 == 2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
            if (bVar14 || PVar13 != PRECISION_LOWP) {
              pcVar6 = glu::getDataTypeName(DVar2);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
              }
              else {
                sVar7 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&caseName,pcVar6,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
              pcVar6 = glu::getPrecisionName(PVar13);
              if (pcVar6 == (char *)0x0) {
                std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
              }
              else {
                sVar7 = strlen(pcVar6);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&caseName,pcVar6,sVar7);
              }
              pLVar8 = (LinearDerivateCase *)operator_new(0x118);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              std::__cxx11::stringbuf::str();
              LinearDerivateCase::LinearDerivateCase
                        (pLVar8,pCVar1,(char *)local_210,"",local_224,DVar2,PVar13,
                         (deUint32)local_1f0,(SurfaceType)local_220,(int)local_218,
                         "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                        );
              tcu::TestNode::addChild(local_1d8,(TestNode *)pLVar8);
              this = (ShaderDerivateTests *)local_1e8;
              if (local_210 != local_200) {
                operator_delete(local_210,local_200[0] + 1);
                this = (ShaderDerivateTests *)local_1e8;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
            std::ios_base::~ios_base(local_138);
            PVar13 = PVar13 + PRECISION_MEDIUMP;
          } while (PVar13 != PRECISION_LAST);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 5);
        lVar12 = local_1b8 + 1;
      } while (lVar12 != 3);
      lVar12 = 1;
      uVar9 = 0;
    } while ((local_1ac & 1) != 0);
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"texture",
               "Derivate of texture lookup result");
    tcu::TestNode::addChild(local_1e0,pTVar4);
    lVar12 = 0;
    local_1c0 = pTVar4;
    do {
      pTVar4 = local_1c0;
      pTVar5 = (TestNode *)operator_new(0x70);
      local_1b8 = lVar12;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,
                 init::s_textureConfigs[lVar12].name,"");
      local_220 = *(TestNode **)&init::s_textureConfigs[lVar12].surfaceType;
      uStack_1d0 = 0;
      local_1f0 = CONCAT44(local_1f0._4_4_,init::s_textureConfigs[lVar12].hint);
      local_218 = pTVar5;
      local_1d8 = local_220;
      tcu::TestNode::addChild(pTVar4,pTVar5);
      uVar10 = 1;
      do {
        PVar13 = PRECISION_LOWP;
        do {
          DVar2 = TYPE_FLOAT;
          if (1 < uVar10) {
            DVar2 = glu::getDataTypeFloatVec(uVar10);
          }
          bVar14 = (uint)local_220 == 2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (bVar14 || PVar13 != PRECISION_LOWP) {
            pcVar6 = glu::getDataTypeName(DVar2);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,"_",1);
            pcVar6 = glu::getPrecisionName(PVar13);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)auStack_228 + (int)*(undefined8 *)(_caseName + -0x18) + 0x80);
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&caseName,pcVar6,sVar7);
            }
            pTVar4 = (TestNode *)operator_new(0x120);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            std::__cxx11::stringbuf::str();
            tcu::TestCase::TestCase((TestCase *)pTVar4,pCVar1->m_testCtx,(char *)local_210,"");
            pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
            pTVar4[1].m_name._M_string_length = (size_type)((long)&pTVar4[1].m_name.field_2 + 8);
            pTVar4[1].m_name.field_2._M_allocated_capacity = 0;
            pTVar4[1].m_name.field_2._M_local_buf[8] = '\0';
            *(undefined1 (*) [16])&pTVar4[1].m_description._M_string_length = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&pTVar4[1].m_description.field_2 + 8) =
                 (undefined1  [16])0x0;
            pTVar4[1].m_children.
            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            pTVar4[1].m_children.
            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined1 (*) [16])
             &pTVar4[1].m_children.
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
            pTVar4->_vptr_TestNode = (_func_int **)&PTR__TextureDerivateCase_00d0d6f8;
            *(DerivateFunc *)((long)&pTVar4[2].m_name._M_dataplus._M_p + 4) = local_224;
            *(undefined1 (*) [16])&pTVar4[2].m_name._M_string_length = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&pTVar4[2].m_name.field_2 + 8) = (undefined1  [16])0x0;
            pTVar4[2].m_description._M_string_length = 0;
            *(DataType *)&pTVar4[1].m_testCtx = DVar2;
            *(Precision *)((long)&pTVar4[1].m_testCtx + 4) = PVar13;
            pTVar4[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
            *(undefined4 *)&pTVar4[2].m_name._M_dataplus._M_p = (undefined4)local_1f0;
            pTVar4[2].m_testCtx = (TestContext *)local_1d8;
            tcu::TestNode::addChild(local_218,pTVar4);
            this = (ShaderDerivateTests *)local_1e8;
            if (local_210 != local_200) {
              operator_delete(local_210,local_200[0] + 1);
              this = (ShaderDerivateTests *)local_1e8;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          iVar3 = std::ios_base::~ios_base(local_138);
          PVar13 = PVar13 + PRECISION_MEDIUMP;
        } while (PVar13 != PRECISION_LAST);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 5);
      lVar12 = local_1b8 + 1;
    } while (lVar12 != 4);
    uVar11 = (ulong)(local_224 + DERIVATE_DFDY);
  } while (local_224 + DERIVATE_DFDY != 3);
  return iVar3;
}

Assistant:

void ShaderDerivateTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		description;
		const char*		source;
	} s_linearDerivateCases[] =
	{
		{
			"linear",
			"Basic derivate of linearly interpolated argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"in_function",
			"Derivate of linear function argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"\n"
			"${PRECISION} ${DATATYPE} computeRes (${PRECISION} ${DATATYPE} value)\n"
			"{\n"
			"	return ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"}\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = computeRes(v_coord);\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_if",
			"Derivate of linearly interpolated value in static if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (false)\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_loop",
			"Derivate of linearly interpolated value in static loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < 2; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_switch",
			"Derivate of linearly interpolated value in static switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (1)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_if",
			"Derivate of linearly interpolated value in uniform if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform bool ub_true;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (ub_true)"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_loop",
			"Derivate of linearly interpolated value in uniform loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_two;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < ui_two; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_switch",
			"Derivate of linearly interpolated value in uniform switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_one;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (ui_one)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_fboConfigs[] =
	{
		{ "fbo",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa2",	SURFACETYPE_UNORM_FBO,				2 },
		{ "fbo_msaa4",	SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",	SURFACETYPE_FLOAT_FBO,				0 },
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} s_hints[] =
	{
		{ "fastest",	GL_FASTEST	},
		{ "nicest",		GL_NICEST	},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_hintFboConfigs[] =
	{
		{ "default",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa4",		SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",		SURFACETYPE_FLOAT_FBO,				0 }
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
		deUint32		hint;
	} s_textureConfigs[] =
	{
		{ "basic",			SURFACETYPE_DEFAULT_FRAMEBUFFER,	0,	GL_DONT_CARE	},
		{ "msaa4",			SURFACETYPE_UNORM_FBO,				4,	GL_DONT_CARE	},
		{ "float_fastest",	SURFACETYPE_FLOAT_FBO,				0,	GL_FASTEST		},
		{ "float_nicest",	SURFACETYPE_FLOAT_FBO,				0,	GL_NICEST		},
	};

	// .dfdx, .dfdy, .fwidth
	for (int funcNdx = 0; funcNdx < DERIVATE_LAST; funcNdx++)
	{
		const DerivateFunc			function		= DerivateFunc(funcNdx);
		tcu::TestCaseGroup* const	functionGroup	= new tcu::TestCaseGroup(m_testCtx, getDerivateFuncCaseName(function), getDerivateFuncName(function));
		addChild(functionGroup);

		// .constant - no precision variants, checks that derivate of constant arguments is 0
		{
			tcu::TestCaseGroup* const constantGroup = new tcu::TestCaseGroup(m_testCtx, "constant", "Derivate of constant argument");
			functionGroup->addChild(constantGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				const glu::DataType dataType = vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
				constantGroup->addChild(new ConstantDerivateCase(m_context, glu::getDataTypeName(dataType), "", function, dataType));
			}
		}

		// Cases based on LinearDerivateCase
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_linearDerivateCases); caseNdx++)
		{
			tcu::TestCaseGroup* const linearCaseGroup	= new tcu::TestCaseGroup(m_testCtx, s_linearDerivateCases[caseNdx].name, s_linearDerivateCases[caseNdx].description);
			const char*			source					= s_linearDerivateCases[caseNdx].source;
			functionGroup->addChild(linearCaseGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const SurfaceType		surfaceType		= SURFACETYPE_DEFAULT_FRAMEBUFFER;
					const int				numSamples		= 0;
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (caseNdx != 0 && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to default FB.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					linearCaseGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// Fbo cases
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_fboConfigs); caseNdx++)
		{
			tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_fboConfigs[caseNdx].name, "Derivate usage when rendering into FBO");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const SurfaceType			surfaceType		= s_fboConfigs[caseNdx].surfaceType;
			const int					numSamples		= s_fboConfigs[caseNdx].numSamples;
			functionGroup->addChild(fboGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// .fastest, .nicest
		for (int hintCaseNdx = 0; hintCaseNdx < DE_LENGTH_OF_ARRAY(s_hints); hintCaseNdx++)
		{
			tcu::TestCaseGroup* const	hintGroup		= new tcu::TestCaseGroup(m_testCtx, s_hints[hintCaseNdx].name, "Shader derivate hints");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const deUint32				hint			= s_hints[hintCaseNdx].hint;
			functionGroup->addChild(hintGroup);

			for (int fboCaseNdx = 0; fboCaseNdx < DE_LENGTH_OF_ARRAY(s_hintFboConfigs); fboCaseNdx++)
			{
				tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_hintFboConfigs[fboCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_hintFboConfigs[fboCaseNdx].surfaceType;
				const int					numSamples		= s_hintFboConfigs[fboCaseNdx].numSamples;
				hintGroup->addChild(fboGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
					}
				}
			}
		}

		// .texture
		{
			tcu::TestCaseGroup* const textureGroup = new tcu::TestCaseGroup(m_testCtx, "texture", "Derivate of texture lookup result");
			functionGroup->addChild(textureGroup);

			for (int texCaseNdx = 0; texCaseNdx < DE_LENGTH_OF_ARRAY(s_textureConfigs); texCaseNdx++)
			{
				tcu::TestCaseGroup*	const	caseGroup		= new tcu::TestCaseGroup(m_testCtx, s_textureConfigs[texCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_textureConfigs[texCaseNdx].surfaceType;
				const int					numSamples		= s_textureConfigs[texCaseNdx].numSamples;
				const deUint32				hint			= s_textureConfigs[texCaseNdx].hint;
				textureGroup->addChild(caseGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						caseGroup->addChild(new TextureDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples));
					}
				}
			}
		}
	}
}